

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowStackToolWindow(bool *p_open)

{
  ImGuiWindow_conflict *pIVar1;
  ImGuiStackLevelInfo *pIVar2;
  ImVec2 IVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ImGuiContext_conflict1 *pIVar6;
  ImGuiContext_conflict1 *pIVar7;
  bool bVar8;
  ImU32 color;
  undefined8 *puVar9;
  long lVar10;
  char *text;
  ulong uVar11;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  ImVec4 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  bVar8 = Begin("Dear ImGui Stack Tool",p_open,0);
  pIVar6 = GImGui;
  if ((bVar8) &&
     (pIVar1 = GImGui->CurrentWindow, pIVar1->WriteAccessed = true, pIVar1->BeginCount < 2)) {
    Text("HoveredId: 0x%08X, ActiveId:  0x%08X",(ulong)pIVar6->HoveredIdPreviousFrame,
         (ulong)pIVar6->ActiveId);
    pIVar7 = GImGui;
    pIVar1 = GImGui->CurrentWindow;
    pIVar1->WriteAccessed = true;
    if (pIVar1->SkipItems == false) {
      (pIVar1->DC).CursorPos.x = (pIVar7->Style).ItemSpacing.x + (pIVar1->DC).CursorPosPrevLine.x;
      (pIVar1->DC).CursorPos.y = (pIVar1->DC).CursorPosPrevLine.y;
      (pIVar1->DC).CurrLineSize = (pIVar1->DC).PrevLineSize;
      (pIVar1->DC).CurrLineTextBaseOffset = (pIVar1->DC).PrevLineTextBaseOffset;
    }
    MetricsHelpMarker(
                     "Hover an item with the mouse to display elements of the ID Stack leading to the item\'s final ID.\nEach level of the stack correspond to a PushID() call.\nAll levels of the stack are hashed together to make the final ID of a widget (ID displayed at the bottom level of the stack).\nRead FAQ entry about the ID stack for details."
                     );
    (pIVar6->DebugStackTool).LastActiveFrame = pIVar6->FrameCount;
    if (0 < (pIVar6->DebugStackTool).Results.Size) {
      local_58.x = 0.0;
      local_58.y = 0.0;
      bVar8 = BeginTable("##table",3,0x780,(ImVec2 *)&local_58,0.0);
      if (bVar8) {
        IVar3 = ImFont::CalcTextSizeA
                          (GImGui->Font,GImGui->FontSize,3.4028235e+38,-1.0,"0xDDDDDDDD",(char *)0x0
                           ,(char **)0x0);
        local_48 = (float)(int)(IVar3.x + 0.99999);
        fStack_44 = (float)(int)IVar3.y;
        fStack_40 = (float)(int)extraout_XMM0_Dc;
        fStack_3c = (float)(int)extraout_XMM0_Dd;
        TableSetupColumn("Seed",0x10,local_48,0);
        TableSetupColumn("PushID",8,0.0,0);
        TableSetupColumn("Result",0x10,local_48,0);
        TableHeadersRow();
        if (0 < (pIVar6->DebugStackTool).Results.Size) {
          lVar10 = 6;
          uVar11 = 0;
          do {
            pIVar2 = (pIVar6->DebugStackTool).Results.Data;
            TableNextColumn();
            if ((uVar11 != 0) && ((long)(pIVar6->DebugStackTool).Results.Size < (long)uVar11)) {
              __assert_fail("i >= 0 && i < Size",
                            "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                            ,0x706,
                            "T &ImVector<ImGuiStackLevelInfo>::operator[](int) [T = ImGuiStackLevelInfo]"
                           );
            }
            Text("0x%08X");
            TableNextColumn();
            if (uVar11 == 0) {
              puVar9 = (undefined8 *)0x0;
              if (pIVar2->Desc[lVar10 + -6] == '\0') {
                puVar9 = (undefined8 *)
                         ImGuiStorage::GetVoidPtr
                                   (&GImGui->WindowsById,*(ImGuiID *)(pIVar2->Desc + lVar10 + -0xc))
                ;
              }
            }
            else {
              puVar9 = (undefined8 *)0x0;
            }
            if (puVar9 == (undefined8 *)0x0) {
              if (pIVar2->Desc[lVar10 + -7] == '\x01') {
                text = pIVar2->Desc + lVar10 + -6;
              }
              else {
                if ((pIVar6->DebugStackTool).StackLevel < (pIVar6->DebugStackTool).Results.Size)
                goto LAB_001a8dca;
                text = "???";
              }
              TextUnformatted(text,(char *)0x0);
            }
            else {
              Text("\"%s\" [window]",*puVar9);
            }
LAB_001a8dca:
            TableNextColumn();
            Text("0x%08X",(ulong)*(uint *)(pIVar2->Desc + lVar10 + -0xc));
            if (uVar11 == (pIVar6->DebugStackTool).Results.Size - 1) {
              local_58.x = (GImGui->Style).Colors[0x18].x;
              local_58.y = (GImGui->Style).Colors[0x18].y;
              uVar4 = (GImGui->Style).Colors[0x18].z;
              uVar5 = (GImGui->Style).Colors[0x18].w;
              local_58.w = (GImGui->Style).Alpha * (float)uVar5;
              local_58.z = (float)uVar4;
              color = ColorConvertFloat4ToU32(&local_58);
              TableSetBgColor(3,color,-1);
            }
            uVar11 = uVar11 + 1;
            lVar10 = lVar10 + 0x40;
          } while ((long)uVar11 < (long)(pIVar6->DebugStackTool).Results.Size);
        }
        EndTable();
      }
    }
  }
  End();
  return;
}

Assistant:

void ImGui::ShowStackToolWindow(bool* p_open)
{
    if (!Begin("Dear ImGui Stack Tool", p_open) || GetCurrentWindow()->BeginCount > 1)
    {
        End();
        return;
    }

    // Display hovered/active status
    ImGuiContext& g = *GImGui;
    const ImGuiID hovered_id = g.HoveredIdPreviousFrame;
    const ImGuiID active_id = g.ActiveId;
#ifdef IMGUI_ENABLE_TEST_ENGINE
    Text("HoveredId: 0x%08X (\"%s\"), ActiveId:  0x%08X (\"%s\")", hovered_id, hovered_id ? ImGuiTestEngine_FindItemDebugLabel(&g, hovered_id) : "", active_id, active_id ? ImGuiTestEngine_FindItemDebugLabel(&g, active_id) : "");
#else
    Text("HoveredId: 0x%08X, ActiveId:  0x%08X", hovered_id, active_id);
#endif
    SameLine();
    MetricsHelpMarker("Hover an item with the mouse to display elements of the ID Stack leading to the item's final ID.\nEach level of the stack correspond to a PushID() call.\nAll levels of the stack are hashed together to make the final ID of a widget (ID displayed at the bottom level of the stack).\nRead FAQ entry about the ID stack for details.");

    // Display decorated stack
    ImGuiStackTool* tool = &g.DebugStackTool;
    tool->LastActiveFrame = g.FrameCount;
    if (tool->Results.Size > 0 && BeginTable("##table", 3, ImGuiTableFlags_Borders))
    {
        const float id_width = CalcTextSize("0xDDDDDDDD").x;
        TableSetupColumn("Seed", ImGuiTableColumnFlags_WidthFixed, id_width);
        TableSetupColumn("PushID", ImGuiTableColumnFlags_WidthStretch);
        TableSetupColumn("Result", ImGuiTableColumnFlags_WidthFixed, id_width);
        TableHeadersRow();
        for (int n = 0; n < tool->Results.Size; n++)
        {
            ImGuiStackLevelInfo* info = &tool->Results[n];
            TableNextColumn();
            Text("0x%08X", (n > 0) ? tool->Results[n - 1].ID : 0);

            TableNextColumn();
            ImGuiWindow* window = (info->Desc[0] == 0 && n == 0) ? FindWindowByID(info->ID) : NULL;
            if (window)                                         // Source: window name (because the root ID don't call GetID() and so doesn't get hooked)
                Text("\"%s\" [window]", window->Name);
            else if (info->QuerySuccess)                        // Source: GetID() hooks (prioritize over ItemInfo() because we frequently use patterns like: PushID(str), Button("") where they both have same id)
                TextUnformatted(info->Desc);
            else if (tool->StackLevel >= tool->Results.Size)    // Only start using fallback below when all queries are done, so during queries we don't flickering ??? markers.
            {
#ifdef IMGUI_ENABLE_TEST_ENGINE
                if (const char* label = ImGuiTestEngine_FindItemDebugLabel(&g, info->ID))    // Source: ImGuiTestEngine's ItemInfo()
                    Text("??? \"%s\"", label);
                else
#endif
                    TextUnformatted("???");
            }

            TableNextColumn();
            Text("0x%08X", info->ID);
            if (n == tool->Results.Size - 1)
                TableSetBgColor(ImGuiTableBgTarget_CellBg, GetColorU32(ImGuiCol_Header));
        }
        EndTable();
    }
    End();
}